

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

Test * BuildWithDepsLogTestDepsIgnoredInDryRun::Create(void)

{
  BuildTest *this;
  
  this = (BuildTest *)operator_new(0x4a8);
  BuildTest::BuildTest(this);
  this[1].super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&this[1].super_StateTestWithBuiltinRules.state_;
  this[1].super_StateTestWithBuiltinRules.super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_StateTestWithBuiltinRules.super_Test.field_0x9 = 0;
  this[1].super_StateTestWithBuiltinRules.super_Test.assertion_failures_ = 0;
  *(undefined1 *)&this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_buckets = 0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       &this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_element_count = 0;
  *(undefined1 *)
   &this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy._M_max_load_factor =
       0;
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithDepsLogTest_001f62f8;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_001f6338;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepsIgnoredInDryRun) {
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in1", "");

  State state;
  ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

  // The deps log is NULL in dry runs.
  config_.dry_run = true;
  Builder builder(&state, config_, NULL, NULL, &fs_, &status_, 0);
  builder.command_runner_.reset(&command_runner_);
  command_runner_.commands_ran_.clear();

  string err;
  EXPECT_TRUE(builder.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  builder.command_runner_.release();
}